

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  bool bVar1;
  uint uVar2;
  char *__s;
  size_t sVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  string_view sVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  sVar6 = cmSystemTools::GetSystemName();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_HOST_SYSTEM_NAME",(allocator<char> *)&local_38);
  SetDefinition(this,&local_58,sVar6);
  std::__cxx11::string::~string((string *)&local_58);
  __y._M_str = "Windows";
  __y._M_len = 7;
  bVar1 = std::operator==(sVar6,__y);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"WIN32",(allocator<char> *)&local_38);
    value._M_str = "1";
    value._M_len = 1;
    SetDefinition(this,&local_58,value);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CMAKE_HOST_WIN32",(allocator<char> *)&local_38);
    value_00._M_str = "1";
    value_00._M_len = 1;
    SetDefinition(this,&local_58,value_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"UNIX",(allocator<char> *)&local_38);
    sVar6._M_str = "1";
    sVar6._M_len = 1;
    SetDefinition(this,&local_58,sVar6);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CMAKE_HOST_UNIX",(allocator<char> *)&local_38);
    value_01._M_str = "1";
    value_01._M_len = 1;
    SetDefinition(this,&local_58,value_01);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"LINUX",(allocator<char> *)&local_38);
  value_02._M_str = "1";
  value_02._M_len = 1;
  SetDefinition(this,&local_58,value_02);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_HOST_LINUX",(allocator<char> *)&local_38);
  value_03._M_str = "1";
  value_03._M_len = 1;
  SetDefinition(this,&local_58,value_03);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_MAJOR_VERSION",&local_59);
  uVar2 = cmVersion::GetMajorVersion();
  std::__cxx11::to_string(&local_38,uVar2);
  value_04._M_str = local_38._M_dataplus._M_p;
  value_04._M_len = local_38._M_string_length;
  SetDefinition(this,&local_58,value_04);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_MINOR_VERSION",&local_59);
  uVar2 = cmVersion::GetMinorVersion();
  std::__cxx11::to_string(&local_38,uVar2);
  value_05._M_str = local_38._M_dataplus._M_p;
  value_05._M_len = local_38._M_string_length;
  SetDefinition(this,&local_58,value_05);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_PATCH_VERSION",&local_59);
  uVar2 = cmVersion::GetPatchVersion();
  std::__cxx11::to_string(&local_38,uVar2);
  value_06._M_str = local_38._M_dataplus._M_p;
  value_06._M_len = local_38._M_string_length;
  SetDefinition(this,&local_58,value_06);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_TWEAK_VERSION",&local_59);
  uVar2 = cmVersion::GetTweakVersion();
  std::__cxx11::to_string(&local_38,uVar2);
  value_07._M_str = local_38._M_dataplus._M_p;
  value_07._M_len = local_38._M_string_length;
  SetDefinition(this,&local_58,value_07);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_VERSION",(allocator<char> *)&local_38);
  __s = cmVersion::GetCMakeVersion();
  sVar3 = strlen(__s);
  value_08._M_str = __s;
  value_08._M_len = sVar3;
  SetDefinition(this,&local_58,value_08);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_FILES_DIRECTORY",(allocator<char> *)&local_38);
  value_09._M_str = "/CMakeFiles";
  value_09._M_len = 0xb;
  SetDefinition(this,&local_58,value_09);
  std::__cxx11::string::~string((string *)&local_58);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"INCLUDE_REGULAR_EXPRESSION",(allocator<char> *)&local_38);
  cmPropertyMap::SetProperty(&pBVar5->Properties,&local_58,"^.*$");
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
  /* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
    With CMake must separate between target and host platform. In most cases
    the tests for WIN32, UNIX and APPLE will be for the target system, so an
    additional set of variables for the host system is required ->
    CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
    WIN32, UNIX and APPLE are now set in the platform files in
    Modules/Platforms/.
    To keep cmake scripts (-P) and custom language and compiler modules
    working, these variables are still also set here in this place, but they
    will be reset in CMakeSystemSpecificInformation.cmake before the platform
    files are executed. */
  cm::string_view hostSystemName = cmSystemTools::GetSystemName();
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", hostSystemName);
  if (hostSystemName == "Windows") {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  } else {
    this->SetDefinition("UNIX", "1");
    this->SetDefinition("CMAKE_HOST_UNIX", "1");
  }
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmIsOn(legacy)) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

#if defined(__OpenBSD__)
  this->SetDefinition("BSD", "OpenBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "OpenBSD");
#elif defined(__FreeBSD__)
  this->SetDefinition("BSD", "FreeBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "FreeBSD");
#elif defined(__NetBSD__)
  this->SetDefinition("BSD", "NetBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "NetBSD");
#elif defined(__DragonFly__)
  this->SetDefinition("BSD", "DragonFlyBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "DragonFlyBSD");
#endif

#if defined(__linux__)
  this->SetDefinition("LINUX", "1");
  this->SetDefinition("CMAKE_HOST_LINUX", "1");
#endif

  this->SetDefinition("CMAKE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()));
  this->SetDefinition("CMAKE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()));
  this->SetDefinition("CMAKE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()));
  this->SetDefinition("CMAKE_TWEAK_VERSION",
                      std::to_string(cmVersion::GetTweakVersion()));
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY", "/CMakeFiles");

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}